

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O2

bool __thiscall ConditionalEstimator::hasAdditionalEvents(ConditionalEstimator *this)

{
  bool *pbVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_2c;
  
  bVar4 = false;
  if (this->bRejection == true) {
    iVar3 = -1;
    for (iVar2 = -this->aRejectionInterval[0]; (iVar3 < 1 && (iVar2 < this->aRejectionInterval[1]));
        iVar2 = iVar2 + 1) {
      local_2c = this->nPre + iVar2 + -1;
      pbVar1 = Ring<bool>::operator[](&this->condEventRing,&local_2c);
      iVar3 = iVar3 + (uint)*pbVar1;
    }
    bVar4 = iVar3 != 0;
  }
  return bVar4;
}

Assistant:

bool ConditionalEstimator::hasAdditionalEvents()
{
	if (!bRejection)
		return false;
	else {
		int events = -1;
		for (int i=-aRejectionInterval[0]; events<1 && i<aRejectionInterval[1]; ++i)
			events += condEventRing[nPre+1-2+i];
		return events;
	}
}